

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundImpDirWrapper.cpp
# Opt level: O0

bool __thiscall BoundImpDirWrapper::wrap(BoundImpDirWrapper *this)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  IMAGE_DATA_DIRECTORY *pIVar4;
  size_t local_28;
  size_t cntr;
  size_t oldCount;
  BoundImpDirWrapper *this_local;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  sVar1 = this->importsCount;
  this->importsCount = 0;
  pIVar4 = DataDirEntryWrapper::getDataDirectory(&this->super_DataDirEntryWrapper);
  if (pIVar4 == (IMAGE_DATA_DIRECTORY *)0x0) {
    sVar2 = this->importsCount;
  }
  else {
    local_28 = 0;
    while( true ) {
      uVar3 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2e])
                        (this,local_28);
      if ((uVar3 & 1) == 0) break;
      local_28 = local_28 + 1;
    }
    this->importsCount = local_28;
    sVar2 = this->importsCount;
  }
  this_local._7_1_ = sVar1 != sVar2;
  return this_local._7_1_;
}

Assistant:

bool BoundImpDirWrapper::wrap()
{
    clear();
    size_t oldCount = this->importsCount;
    this->importsCount = 0;

    if (!getDataDirectory()) {
        return (oldCount != this->importsCount); //has count changed
    }

    size_t cntr = 0;
    while (loadNextEntry(cntr)) {
        cntr++;
    }

    this->importsCount = cntr;
    return (oldCount != this->importsCount); //has count changed
}